

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O2

boolean check_tutorial_oclass(int oclass)

{
  if (oclass - 2U < 0xd) {
    check_tutorial_message(*(int *)(&DAT_002c15cc + (ulong)(oclass - 2U) * 4));
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean check_tutorial_oclass(int oclass)
{
	switch(oclass) {
	case WEAPON_CLASS: check_tutorial_message(QT_T_ITEM_WEAPON);	return TRUE;
	case FOOD_CLASS:   check_tutorial_message(QT_T_ITEM_FOOD);	return TRUE;
	case GEM_CLASS:    check_tutorial_message(QT_T_ITEM_GEM);	return TRUE;
	case TOOL_CLASS:   check_tutorial_message(QT_T_ITEM_TOOL);	return TRUE;
	case AMULET_CLASS: check_tutorial_message(QT_T_ITEM_AMULET);	return TRUE;
	case POTION_CLASS: check_tutorial_message(QT_T_ITEM_POTION);	return TRUE;
	case SCROLL_CLASS: check_tutorial_message(QT_T_ITEM_SCROLL);	return TRUE;
	case SPBOOK_CLASS: check_tutorial_message(QT_T_ITEM_BOOK);	return TRUE;
	case ARMOR_CLASS:  check_tutorial_message(QT_T_ITEM_ARMOR);	return TRUE;
	case WAND_CLASS:   check_tutorial_message(QT_T_ITEM_WAND);	return TRUE;
	case RING_CLASS:   check_tutorial_message(QT_T_ITEM_RING);	return TRUE;
	case ROCK_CLASS:   check_tutorial_message(QT_T_ITEM_STATUE);	return TRUE;
	case COIN_CLASS:   check_tutorial_message(QT_T_ITEM_GOLD);	return TRUE;
	default: return FALSE; /* venom/ball/chain/mimic don't concern us */
	}
}